

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O1

int __thiscall
nuraft::nuraft_global_mgr::worker_handle::shutdown(worker_handle *this,int __fd,int __how)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  element_type *peVar4;
  
  LOCK();
  (this->stopping_)._M_base._M_i = true;
  UNLOCK();
  peVar4 = (this->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4 != (element_type *)0x0) {
    if ((peVar4->_M_id)._M_thread != 0) {
      EventAwaiter::invoke(&this->ea_);
      peVar4 = (element_type *)std::thread::join();
    }
    p_Var2 = (this->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    (this->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->thread_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var2->_M_use_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = p_Var2->_M_use_count;
        p_Var2->_M_use_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*p_Var2->_vptr__Sp_counted_base[2])(p_Var2);
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &p_Var2->_M_weak_count;
          iVar3 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar3 = p_Var2->_M_weak_count;
          p_Var2->_M_weak_count = iVar3 + -1;
        }
        if (iVar3 == 1) {
          iVar3 = (*p_Var2->_vptr__Sp_counted_base[3])(p_Var2);
          return iVar3;
        }
      }
      return iVar3;
    }
  }
  return (int)peVar4;
}

Assistant:

void shutdown() {
        stopping_ = true;
        if (thread_) {
            if (thread_->joinable()) {
                ea_.invoke();
                thread_->join();
            }
            thread_.reset();
        }
    }